

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_test.cpp
# Opt level: O2

void evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
               (rt_expr<viennamath::rt_expression_interface<double>_> *e,double ref_solution)

{
  rt_expression_interface<double> *prVar1;
  uint __line;
  ostream *poVar2;
  char *__assertion;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  numeric_type nVar3;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_e8;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_e0;
  rt_expr<viennamath::rt_expression_interface<double>_> local_d8;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_d0;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_c8;
  rt_expr<viennamath::rt_expression_interface<double>_> local_c0;
  vector<double,_std::allocator<double>_> p;
  ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
  local_a0;
  ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
  local_78;
  ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
  local_50;
  
  std::vector<double,_std::allocator<double>_>::vector(&p,3,(allocator_type *)&local_a0);
  *p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       4.0;
  p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start[1]
       = 6.0;
  p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start[2]
       = 8.0;
  poVar2 = viennamath::operator<<((ostream *)&std::cout,e);
  std::operator<<(poVar2," at STL (");
  poVar2 = std::ostream::_M_insert<double>
                     (*p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
  std::operator<<(poVar2,", ");
  poVar2 = std::ostream::_M_insert<double>
                     (p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[1]);
  std::operator<<(poVar2,", ");
  poVar2 = std::ostream::_M_insert<double>
                     (p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[2]);
  poVar2 = std::operator<<(poVar2,")");
  std::operator<<(poVar2," = ");
  prVar1 = (e->rt_expr_)._M_ptr;
  (*prVar1->_vptr_rt_expression_interface[5])(prVar1,&p);
  poVar2 = std::ostream::_M_insert<double>(extraout_XMM0_Qa);
  std::operator<<(poVar2," = ");
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr(&local_c0,e);
  (*(*(_func_int ***)local_c0.rt_expr_._M_ptr)[5])(local_c0.rt_expr_._M_ptr,&p);
  poVar2 = std::ostream::_M_insert<double>(extraout_XMM0_Qa_00);
  std::operator<<(poVar2," (reference solution: ");
  poVar2 = std::ostream::_M_insert<double>(ref_solution);
  poVar2 = std::operator<<(poVar2,")");
  std::endl<char,std::char_traits<char>>(poVar2);
  if (local_c0.rt_expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(*(_func_int ***)local_c0.rt_expr_._M_ptr)[1])();
  }
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_c8,e);
  (*(local_c8._M_ptr)->_vptr_rt_expression_interface[5])(local_c8._M_ptr,&p);
  if (extraout_XMM0_Qa_01 <= ref_solution) {
    viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
              ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_d0,e);
    (*(local_d0._M_ptr)->_vptr_rt_expression_interface[5])(local_d0._M_ptr,&p);
    if (ref_solution <= extraout_XMM0_Qa_02) {
      if (local_d0._M_ptr != (rt_expression_interface<double> *)0x0) {
        (*(local_d0._M_ptr)->_vptr_rt_expression_interface[1])();
      }
      if (local_c8._M_ptr != (rt_expression_interface<double> *)0x0) {
        (*(local_c8._M_ptr)->_vptr_rt_expression_interface[1])();
      }
      poVar2 = viennamath::operator<<((ostream *)&std::cout,e);
      poVar2 = std::operator<<(poVar2," at vector_3 (");
      local_a0.t0_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_001333a8;
      local_a0.t0_.s = 4.0;
      local_a0.t1_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_00133468;
      local_a0.t1_.s = 6;
      poVar2 = viennamath::operator<<(poVar2,&local_a0);
      poVar2 = std::operator<<(poVar2,")");
      std::operator<<(poVar2," = ");
      local_78.t0_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_001333a8;
      local_78.t0_.s = 4.0;
      local_78.t1_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_00133468;
      local_78.t1_.s = 6;
      nVar3 = viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator()
                        ((rt_expr<viennamath::rt_expression_interface<double>> *)e,&local_78);
      poVar2 = std::ostream::_M_insert<double>(nVar3);
      std::operator<<(poVar2," = ");
      viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr(&local_d8,e);
      local_50.t0_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_001333a8;
      local_50.t0_.s = 4.0;
      local_50.t1_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_00133468;
      local_50.t1_.s = 6;
      nVar3 = viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator()
                        ((rt_expr<viennamath::rt_expression_interface<double>> *)&local_d8,&local_50
                        );
      poVar2 = std::ostream::_M_insert<double>(nVar3);
      std::operator<<(poVar2," (reference solution: ");
      poVar2 = std::ostream::_M_insert<double>(ref_solution);
      poVar2 = std::operator<<(poVar2,")");
      std::endl<char,std::char_traits<char>>(poVar2);
      if (local_d8.rt_expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
        (*(*(_func_int ***)local_d8.rt_expr_._M_ptr)[1])();
      }
      viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
                ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_e0,e);
      local_a0.t0_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_001333a8;
      local_a0.t0_.s = 4.0;
      local_a0.t1_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_00133468;
      local_a0.t1_.s = 6;
      nVar3 = viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator()
                        ((rt_expr<viennamath::rt_expression_interface<double>> *)&local_e0,&local_a0
                        );
      if (nVar3 <= ref_solution) {
        viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
                  ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_e8,e);
        local_78.t0_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
             (_func_int **)&PTR__rt_expression_interface_001333a8;
        local_78.t0_.s = 4.0;
        local_78.t1_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
             (_func_int **)&PTR__rt_expression_interface_00133468;
        local_78.t1_.s = 6;
        nVar3 = viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator()
                          ((rt_expr<viennamath::rt_expression_interface<double>> *)&local_e8,
                           &local_78);
        if (ref_solution <= nVar3) {
          if (local_e8._M_ptr != (rt_expression_interface<double> *)0x0) {
            (*(local_e8._M_ptr)->_vptr_rt_expression_interface[1])();
          }
          if (local_e0._M_ptr != (rt_expression_interface<double> *)0x0) {
            (*(local_e0._M_ptr)->_vptr_rt_expression_interface[1])();
          }
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    (&p.super__Vector_base<double,_std::allocator<double>_>);
          return;
        }
      }
      __assertion = 
      "viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) <= ref_solution && viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) >= ref_solution"
      ;
      __line = 0x4b;
      goto LAB_0011c8c2;
    }
  }
  __assertion = "viennamath::eval(e, p) <= ref_solution && viennamath::eval(e, p) >= ref_solution";
  __line = 0x45;
LAB_0011c8c2:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/viennamath[P]viennamath-dev/tests/src/runtime_test.cpp"
                ,__line,"void evaluations_test(E &, double) [E = viennamath::rt_expr<>]");
}

Assistant:

void evaluations_test(E & e, double ref_solution)
{
  viennamath::rt_constant<double> c4(4.0);
  viennamath::rt_constant<long> c6(6);
  viennamath::ct_constant<8> c8;

  std::vector<double> p(3);
  p[0] = 4;
  p[1] = 6;
  p[2] = 8;


  std::cout << e << " at STL (" << p[0] << ", " << p[1] << ", " << p[2] << ")"
            << " = " << e(p)
            << " = " << viennamath::eval(e,p)
            << " (reference solution: " << ref_solution << ")" << std::endl;
  assert(viennamath::eval(e, p) <= ref_solution && viennamath::eval(e, p) >= ref_solution);

  std::cout << e << " at vector_3 (" << viennamath::make_vector(c4, c6, c8) << ")"
            << " = " << e(viennamath::make_vector(c4, c6, c8))
            << " = " << viennamath::eval(e, viennamath::make_vector(c4, c6, c8))
            << " (reference solution: " << ref_solution << ")" << std::endl;
  assert(viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) <= ref_solution && viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) >= ref_solution);

}